

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O1

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET14_v4::read
          (LASreadItemCompressed_WAVEPACKET14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  I32 pred;
  uint uVar1;
  undefined8 uVar2;
  U32 UVar3;
  I32 IVar4;
  I32 IVar5;
  I32 IVar6;
  I32 IVar7;
  uint uVar8;
  ulong uVar9;
  U64 UVar10;
  undefined4 in_register_00000034;
  undefined8 *puVar11;
  U8 *item;
  
  puVar11 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  uVar9 = (ulong)this->current_context;
  item = this->contexts[uVar9].last_item;
  uVar8 = *__buf;
  if (this->current_context != uVar8) {
    this->current_context = uVar8;
    if (this->contexts[uVar8].unused == true) {
      createAndInitModelsAndDecompressors(this,uVar8,item);
    }
    uVar9 = (ulong)this->current_context * 0x70;
    item = this->contexts[this->current_context].last_item;
  }
  if (this->changed_wavepacket != true) {
    return uVar9;
  }
  UVar3 = ArithmeticDecoder::decodeSymbol
                    (this->dec_wavepacket,this->contexts[this->current_context].m_packet_index);
  *(char *)puVar11 = (char)UVar3;
  UVar10 = *(U64 *)(item + 1);
  uVar8 = *(uint *)(item + 9);
  IVar5 = *(I32 *)(item + 0xd);
  IVar6 = *(I32 *)(item + 0x11);
  IVar7 = *(I32 *)(item + 0x15);
  pred = *(I32 *)(item + 0x19);
  UVar3 = ArithmeticDecoder::decodeSymbol
                    (this->dec_wavepacket,
                     this->contexts[this->current_context].m_offset_diff
                     [this->contexts[this->current_context].sym_last_offset_diff]);
  uVar1 = this->current_context;
  this->contexts[uVar1].sym_last_offset_diff = UVar3;
  if (UVar3 != 0) {
    if (UVar3 == 2) {
      IVar4 = IntegerCompressor::decompress
                        (this->contexts[uVar1].ic_offset_diff,this->contexts[uVar1].last_diff_32,0);
      this->contexts[this->current_context].last_diff_32 = IVar4;
      uVar9 = (ulong)IVar4;
    }
    else {
      if (UVar3 != 1) {
        UVar10 = ArithmeticDecoder::readInt64(this->dec_wavepacket);
        goto LAB_00130dca;
      }
      uVar9 = (ulong)uVar8;
    }
    UVar10 = UVar10 + uVar9;
  }
LAB_00130dca:
  IVar4 = IntegerCompressor::decompress
                    (this->contexts[this->current_context].ic_packet_size,uVar8,0);
  IVar5 = IntegerCompressor::decompress
                    (this->contexts[this->current_context].ic_return_point,IVar5,0);
  IVar6 = IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,IVar6,0);
  IVar7 = IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,IVar7,1);
  uVar8 = IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,pred,2);
  *(char *)((long)puVar11 + 1) = (char)UVar10;
  *(char *)((long)puVar11 + 2) = (char)(UVar10 >> 8);
  *(char *)((long)puVar11 + 3) = (char)(UVar10 >> 0x10);
  *(char *)((long)puVar11 + 4) = (char)(UVar10 >> 0x18);
  *(char *)((long)puVar11 + 5) = (char)(UVar10 >> 0x20);
  *(char *)((long)puVar11 + 6) = (char)(UVar10 >> 0x28);
  *(char *)((long)puVar11 + 7) = (char)(UVar10 >> 0x30);
  *(char *)(puVar11 + 1) = (char)(UVar10 >> 0x38);
  *(char *)((long)puVar11 + 9) = (char)IVar4;
  *(char *)((long)puVar11 + 10) = (char)((uint)IVar4 >> 8);
  *(char *)((long)puVar11 + 0xb) = (char)((uint)IVar4 >> 0x10);
  *(char *)((long)puVar11 + 0xc) = (char)((uint)IVar4 >> 0x18);
  *(char *)((long)puVar11 + 0xd) = (char)IVar5;
  *(char *)((long)puVar11 + 0xe) = (char)((uint)IVar5 >> 8);
  *(char *)((long)puVar11 + 0xf) = (char)((uint)IVar5 >> 0x10);
  *(char *)(puVar11 + 2) = (char)((uint)IVar5 >> 0x18);
  *(char *)((long)puVar11 + 0x11) = (char)IVar6;
  *(char *)((long)puVar11 + 0x12) = (char)((uint)IVar6 >> 8);
  *(char *)((long)puVar11 + 0x13) = (char)((uint)IVar6 >> 0x10);
  *(char *)((long)puVar11 + 0x14) = (char)((uint)IVar6 >> 0x18);
  *(char *)((long)puVar11 + 0x15) = (char)IVar7;
  *(char *)((long)puVar11 + 0x16) = (char)((uint)IVar7 >> 8);
  *(char *)((long)puVar11 + 0x17) = (char)((uint)IVar7 >> 0x10);
  *(char *)(puVar11 + 3) = (char)((uint)IVar7 >> 0x18);
  *(char *)((long)puVar11 + 0x19) = (char)uVar8;
  *(char *)((long)puVar11 + 0x1a) = (char)(uVar8 >> 8);
  *(char *)((long)puVar11 + 0x1b) = (char)(uVar8 >> 0x10);
  *(char *)((long)puVar11 + 0x1c) = (char)(uVar8 >> 0x18);
  uVar2 = puVar11[1];
  *(undefined8 *)item = *puVar11;
  *(undefined8 *)(item + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)puVar11 + 0x15);
  *(undefined8 *)(item + 0xd) = *(undefined8 *)((long)puVar11 + 0xd);
  *(undefined8 *)(item + 0x15) = uVar2;
  return (ulong)(uVar8 >> 0x18);
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET14_v4::read(U8* item, U32& context)
{
  // get last

  U8* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_wavepacket)
  {
    item[0] = (U8)(dec_wavepacket->decodeSymbol(contexts[current_context].m_packet_index));

    LASwavepacket13 this_item_m;
    LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item+1);

    contexts[current_context].sym_last_offset_diff = dec_wavepacket->decodeSymbol(contexts[current_context].m_offset_diff[contexts[current_context].sym_last_offset_diff]);

    if (contexts[current_context].sym_last_offset_diff == 0)
    {
      this_item_m.offset = last_item_m.offset;
    }
    else if (contexts[current_context].sym_last_offset_diff == 1)
    {
      this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
    }
    else if (contexts[current_context].sym_last_offset_diff == 2)
    {
      contexts[current_context].last_diff_32 = contexts[current_context].ic_offset_diff->decompress(contexts[current_context].last_diff_32);
      this_item_m.offset = last_item_m.offset + contexts[current_context].last_diff_32;
    }
    else
    {
      this_item_m.offset = dec_wavepacket->readInt64();
    }

    this_item_m.packet_size = contexts[current_context].ic_packet_size->decompress(last_item_m.packet_size);
    this_item_m.return_point.i32 = contexts[current_context].ic_return_point->decompress(last_item_m.return_point.i32);
    this_item_m.x.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.x.i32, 0);
    this_item_m.y.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.y.i32, 1);
    this_item_m.z.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.z.i32, 2);

    this_item_m.pack(item+1);

    memcpy(last_item, item, 29);
  }
}